

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_statement(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos994;
  int yypos994;
  int yythunkpos991;
  int yypos991;
  int yythunkpos989;
  int yypos989;
  int yythunkpos985;
  int yypos985;
  int yythunkpos982;
  int yypos982;
  int yythunkpos968;
  int yypos968;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar5 = yy__(G);
  if (iVar5 == 0) {
LAB_00107057:
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    iVar5 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_while_stmt(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar6 = yy_use_stmt(G);
      if (iVar6 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar6 = yy_enum_stmt(G);
        if (iVar6 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar3;
          iVar6 = yy_if_stmt(G);
          if (iVar6 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar3;
            iVar6 = yy_for_stmt(G);
            if (iVar6 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar3;
              iVar6 = yy_unless_stmt(G);
              if (iVar6 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar3;
                iVar6 = yy_module_stmt(G);
                if (iVar6 == 0) {
                  G->pos = iVar5;
                  G->thunkpos = iVar3;
                  iVar6 = yy_multi_method_stmt(G);
                  if (iVar6 == 0) {
                    G->pos = iVar5;
                    G->thunkpos = iVar3;
                    iVar6 = yy_package_stmt(G);
                    if (iVar6 == 0) {
                      G->pos = iVar5;
                      G->thunkpos = iVar3;
                      iVar6 = yy_has_stmt(G);
                      if (iVar6 == 0) {
                        G->pos = iVar5;
                        G->thunkpos = iVar3;
                        iVar6 = yymatchString(G,"...");
                        if (iVar6 == 0) {
                          G->pos = iVar5;
                          G->thunkpos = iVar3;
                          iVar6 = yy_funcdef(G);
                          if ((iVar6 == 0) || (iVar6 = yy__(G), iVar6 == 0)) {
                            G->pos = iVar5;
                            G->thunkpos = iVar3;
                            iVar6 = yy_block(G);
                            if (iVar6 == 0) {
                              G->pos = iVar5;
                              G->thunkpos = iVar3;
                              iVar6 = yymatchString(G,"END");
                              if (((iVar6 == 0) || (iVar6 = yy__(G), iVar6 == 0)) ||
                                 (iVar6 = yy_block(G), iVar6 == 0)) {
                                G->pos = iVar5;
                                G->thunkpos = iVar3;
                                iVar6 = yymatchString(G,"BEGIN");
                                if (((iVar6 == 0) || (iVar6 = yy__(G), iVar6 == 0)) ||
                                   (iVar6 = yy_block(G), iVar6 == 0)) {
                                  G->pos = iVar5;
                                  G->thunkpos = iVar3;
                                  iVar6 = yymatchString(G,"KEEP");
                                  if (iVar6 != 0) {
                                    iVar6 = G->pos;
                                    iVar4 = G->thunkpos;
                                    iVar7 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9_");
                                    if (iVar7 == 0) {
                                      G->pos = iVar6;
                                      G->thunkpos = iVar4;
                                      iVar6 = yy__(G);
                                      if ((iVar6 != 0) && (iVar6 = yy_expr(G), iVar6 != 0)) {
                                        yyDo(G,yySet,-1,0,"yySet");
                                        yyDo(G,yy_4_statement,G->begin,G->end,"yy_4_statement");
                                        goto LAB_00107030;
                                      }
                                    }
                                  }
                                  G->pos = iVar5;
                                  G->thunkpos = iVar3;
                                  iVar6 = yymatchString(G,"UNDO");
                                  if (iVar6 != 0) {
                                    iVar6 = G->pos;
                                    iVar4 = G->thunkpos;
                                    iVar7 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9_");
                                    if (iVar7 == 0) {
                                      G->pos = iVar6;
                                      G->thunkpos = iVar4;
                                      iVar6 = yy__(G);
                                      if ((iVar6 != 0) && (iVar6 = yy_expr(G), iVar6 != 0)) {
                                        yyDo(G,yySet,-1,0,"yySet");
                                        yyDo(G,yy_5_statement,G->begin,G->end,"yy_5_statement");
                                        goto LAB_00107030;
                                      }
                                    }
                                  }
                                  G->pos = iVar5;
                                  G->thunkpos = iVar3;
                                  iVar6 = yy_normal_or_postfix_stmt(G);
                                  if (iVar6 == 0) {
                                    G->pos = iVar5;
                                    G->thunkpos = iVar3;
                                    iVar5 = yymatchChar(G,0x3b);
                                    if (iVar5 == 0) goto LAB_00107057;
                                    do {
                                      iVar1 = G->pos;
                                      iVar2 = G->thunkpos;
                                      iVar5 = yymatchChar(G,0x3b);
                                    } while (iVar5 != 0);
                                    G->pos = iVar1;
                                    G->thunkpos = iVar2;
                                    yyDo(G,yy_7_statement,G->begin,G->end,"yy_7_statement");
                                  }
                                  else {
                                    yyDo(G,yySet,-2,0,"yySet");
                                    yyDo(G,yy_6_statement,G->begin,G->end,"yy_6_statement");
                                  }
                                }
                                else {
                                  yyDo(G,yySet,-2,0,"yySet");
                                  yyDo(G,yy_3_statement,G->begin,G->end,"yy_3_statement");
                                }
                              }
                              else {
                                yyDo(G,yySet,-2,0,"yySet");
                                yyDo(G,yy_2_statement,G->begin,G->end,"yy_2_statement");
                              }
                            }
                            else {
                              yyDo(G,yySet,-3,0,"yySet");
                              do {
                                iVar1 = G->pos;
                                iVar2 = G->thunkpos;
                                iVar5 = yymatchChar(G,0x3b);
                              } while (iVar5 != 0);
                              G->pos = iVar1;
                              G->thunkpos = iVar2;
                            }
                          }
                          else {
                            do {
                              iVar1 = G->pos;
                              iVar2 = G->thunkpos;
                              iVar5 = yymatchChar(G,0x3b);
                            } while (iVar5 != 0);
                            G->pos = iVar1;
                            G->thunkpos = iVar2;
                          }
                        }
                        else {
                          yyDo(G,yy_1_statement,G->begin,G->end,"yy_1_statement");
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00107030:
    yyDo(G,yyPop,3,0,"yyPop");
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_statement(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "statement"));
  if (!yy__(G))  goto l967;

  {  int yypos968= G->pos, yythunkpos968= G->thunkpos;  if (!yy_while_stmt(G))  goto l969;
  goto l968;
  l969:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_use_stmt(G))  goto l970;
  goto l968;
  l970:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_enum_stmt(G))  goto l971;
  goto l968;
  l971:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_if_stmt(G))  goto l972;
  goto l968;
  l972:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_for_stmt(G))  goto l973;
  goto l968;
  l973:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_unless_stmt(G))  goto l974;
  goto l968;
  l974:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_module_stmt(G))  goto l975;
  goto l968;
  l975:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_multi_method_stmt(G))  goto l976;
  goto l968;
  l976:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_package_stmt(G))  goto l977;
  goto l968;
  l977:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_has_stmt(G))  goto l978;
  goto l968;
  l978:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "...")) goto l979;
  yyDo(G, yy_1_statement, G->begin, G->end, "yy_1_statement");
  goto l968;
  l979:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_funcdef(G))  goto l980;
  if (!yy__(G))  goto l980;

  l981:;	
  {  int yypos982= G->pos, yythunkpos982= G->thunkpos;  if (!yymatchChar(G, ';')) goto l982;
  goto l981;
  l982:;	  G->pos= yypos982; G->thunkpos= yythunkpos982;
  }  goto l968;
  l980:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_block(G))  goto l983;
  yyDo(G, yySet, -3, 0, "yySet");

  l984:;	
  {  int yypos985= G->pos, yythunkpos985= G->thunkpos;  if (!yymatchChar(G, ';')) goto l985;
  goto l984;
  l985:;	  G->pos= yypos985; G->thunkpos= yythunkpos985;
  }  goto l968;
  l983:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "END")) goto l986;
  if (!yy__(G))  goto l986;
  if (!yy_block(G))  goto l986;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_statement, G->begin, G->end, "yy_2_statement");
  goto l968;
  l986:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "BEGIN")) goto l987;
  if (!yy__(G))  goto l987;
  if (!yy_block(G))  goto l987;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_3_statement, G->begin, G->end, "yy_3_statement");
  goto l968;
  l987:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "KEEP")) goto l988;

  {  int yypos989= G->pos, yythunkpos989= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l989;
  goto l988;
  l989:;	  G->pos= yypos989; G->thunkpos= yythunkpos989;
  }  if (!yy__(G))  goto l988;
  if (!yy_expr(G))  goto l988;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_statement, G->begin, G->end, "yy_4_statement");
  goto l968;
  l988:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchString(G, "UNDO")) goto l990;

  {  int yypos991= G->pos, yythunkpos991= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l991;
  goto l990;
  l991:;	  G->pos= yypos991; G->thunkpos= yythunkpos991;
  }  if (!yy__(G))  goto l990;
  if (!yy_expr(G))  goto l990;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_statement, G->begin, G->end, "yy_5_statement");
  goto l968;
  l990:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yy_normal_or_postfix_stmt(G))  goto l992;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_6_statement, G->begin, G->end, "yy_6_statement");
  goto l968;
  l992:;	  G->pos= yypos968; G->thunkpos= yythunkpos968;  if (!yymatchChar(G, ';')) goto l967;

  l993:;	
  {  int yypos994= G->pos, yythunkpos994= G->thunkpos;  if (!yymatchChar(G, ';')) goto l994;
  goto l993;
  l994:;	  G->pos= yypos994; G->thunkpos= yythunkpos994;
  }  yyDo(G, yy_7_statement, G->begin, G->end, "yy_7_statement");

  }
  l968:;	  yyprintf((stderr, "  ok   statement"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l967:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "statement"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}